

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_compute_branch_cp1_nm(DisasContext_conflict6 *ctx,uint32_t op,int32_t ft,int32_t offset)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  gen_load_fpr64(ctx,t,op);
  tcg_gen_andi_i64_mips64el(tcg_ctx,t,t,1);
  generate_exception_end(ctx,0x14);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_compute_branch_cp1_nm(DisasContext *ctx, uint32_t op,
                                   int32_t ft, int32_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong btarget;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);

    gen_load_fpr64(ctx, t0, ft);
    tcg_gen_andi_i64(tcg_ctx, t0, t0, 1);

    btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);

    switch (op) {
    case NM_BC1EQZC:
        tcg_gen_xori_i64(tcg_ctx, t0, t0, 1);
        ctx->hflags |= MIPS_HFLAG_BC;
        break;
    case NM_BC1NEZC:
        /* t0 already set */
        ctx->hflags |= MIPS_HFLAG_BC;
        break;
    default:
        MIPS_INVAL("cp1 cond branch");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    tcg_gen_trunc_i64_tl(tcg_ctx, tcg_ctx->bcond, t0);

    ctx->btarget = btarget;

out:
    tcg_temp_free_i64(tcg_ctx, t0);
}